

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_1450e9::compressVerify(unsigned_short *raw,int n,uint dekHash)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  Array<char> compressed;
  
  uVar7 = (ulong)(n * 3 + 0x40000);
  pcVar3 = (char *)operator_new__(uVar7);
  compressed._size = uVar7;
  compressed._data = pcVar3;
  uVar2 = Imf_3_4::hufCompress(raw,n,pcVar3);
  lVar4 = 0;
  uVar6 = uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  while( true ) {
    if (uVar6 == (uint)lVar4) break;
    uVar2 = (uVar2 << 5 | uVar2 >> 0x1b) ^ (uint)(byte)pcVar3[lVar4];
    lVar4 = lVar4 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"verifying compressed checksum hash = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  if (uVar2 == dekHash) {
    Imf_3_4::Array<char>::~Array(&compressed);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"hash verification failed. Got ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," expected ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar3 = compressed._data;
  for (uVar7 = 0; uVar6 != (uint)uVar7; uVar7 = uVar7 + 1) {
    *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
         *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
         0xffffffb5 | 8;
    std::ostream::operator<<(&std::cout,(uint)(byte)pcVar3[uVar7]);
    cVar1 = ' ';
    if ((uVar7 & 0xf) == 0) {
      cVar1 = '\n';
    }
    std::operator<<((ostream *)&std::cout,cVar1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  __assert_fail("compressedHash == dekHash",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                ,0xca,
                "void (anonymous namespace)::compressVerify(const unsigned short *, int, const unsigned int)"
               );
}

Assistant:

void
compressVerify (const unsigned short raw[], int n, const unsigned int dekHash)
{
    Array<char> compressed (3 * n + 4 * 65536);

    int nCompressed = hufCompress (raw, n, compressed);

    //
    // This hash algorithm proposed by Donald E. Knuth in
    // The Art Of Computer Programming Volume 3,
    // under the topic of sorting and search chapter 6.4.
    //
    unsigned int         compressedHash = nCompressed;
    const unsigned char* cptr =
        reinterpret_cast<const unsigned char*> ((const char*) compressed);
    for (int i = 0; i < nCompressed; ++i)
    {
        compressedHash =
            ((compressedHash << 5) ^ (compressedHash >> 27)) ^ (*cptr++);
    }

    cout << "verifying compressed checksum hash = " << compressedHash
         << std::endl;

    if (compressedHash != dekHash)
    {
        cout << "hash verification failed. Got " << compressedHash
             << " expected " << dekHash << std::endl;
        const unsigned char* cptr =
            reinterpret_cast<const unsigned char*> ((const char*) compressed);
        for (int i = 0; i < nCompressed; ++i)
        {
            cout << std::hex << (0xFF & (int) (*cptr++));
            if ((i & 0xF) == 0) { cout << '\n'; }
            else { cout << ' '; }
        }
        cout << "\n";
    }

    assert (compressedHash == dekHash);
}